

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::GetCapitalizedType_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  Type TVar1;
  LogMessage *other;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  LogFinisher local_49;
  LogMessage local_48;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(TVar1) {
  case TYPE_DOUBLE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Double";
    pcVar3 = "";
    break;
  case TYPE_FLOAT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Float";
    pcVar3 = "";
    break;
  case TYPE_INT64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Int64";
    pcVar3 = "";
    break;
  case TYPE_UINT64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "UInt64";
    pcVar3 = "";
    break;
  case TYPE_INT32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Int32";
    pcVar3 = "";
    break;
  case TYPE_FIXED64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Fixed64";
    pcVar3 = "";
    break;
  case TYPE_FIXED32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Fixed32";
    pcVar3 = "";
    break;
  case TYPE_BOOL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Bool";
    pcVar3 = "";
    break;
  case TYPE_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "String";
    pcVar3 = "";
    break;
  case TYPE_GROUP:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Group";
    pcVar3 = "";
    break;
  case TYPE_MESSAGE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Message";
    pcVar3 = "";
    break;
  case TYPE_BYTES:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Bytes";
    pcVar3 = "";
    break;
  case TYPE_UINT32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "UInt32";
    pcVar3 = "";
    break;
  case TYPE_ENUM:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Enum";
    pcVar3 = "";
    break;
  case TYPE_SFIXED32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "SFixed32";
    pcVar3 = "";
    break;
  case TYPE_SFIXED64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "SFixed64";
    pcVar3 = "";
    break;
  case TYPE_SINT32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "SInt32";
    pcVar3 = "";
    break;
  case MAX_TYPE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "SInt64";
    pcVar3 = "";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
               ,0x25f);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    uVar2 = std::__throw_logic_error(anon_var_dwarf_1be);
    internal::LogMessage::~LogMessage(&local_48);
    _Unwind_Resume(uVar2);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string GetCapitalizedType(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES:
      return "Bytes";
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}